

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

int plot::detail::utf8_seq_length(uint8_t first)

{
  int iVar1;
  uint uVar2;
  undefined7 in_register_00000039;
  
  if ((char)first < '\0') {
    uVar2 = (uint)CONCAT71(in_register_00000039,first);
    if ((uVar2 & 0xffffffe0) == 0xc0) {
      iVar1 = 2;
    }
    else {
      if ((uVar2 & 0xfffffff0) != 0xe0) {
        return (uint)((uVar2 & 0xfffffff8) == 0xf0) << 2;
      }
      iVar1 = 3;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int utf8_seq_length(std::uint8_t first) {
        if ((first & ~utf8_start_masks[1]) == utf8_start_markers[1])
            return 1;
        else if ((first & ~utf8_start_masks[2]) == utf8_start_markers[2])
            return 2;
        else if ((first & ~utf8_start_masks[3]) == utf8_start_markers[3])
            return 3;
        else if ((first & ~utf8_start_masks[4]) == utf8_start_markers[4])
            return 4;
        else
            return 0;
    }